

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::LinkVertexFragmentCase::test(LinkVertexFragmentCase *this)

{
  uint programObject;
  bool bVar1;
  GLenum err;
  TestError *this_00;
  EVP_PKEY_CTX *ctx;
  
  (*(this->super_SimpleProgramCase).super_ApiCase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[6])();
  SimpleProgramCase::linkProgram(&this->super_SimpleProgramCase);
  err = glu::CallLogWrapper::glGetError
                  (&(this->super_SimpleProgramCase).super_ApiCase.super_CallLogWrapper);
  glu::checkError(err,"Linking failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
                  ,0x208);
  programObject = (this->super_SimpleProgramCase).m_program;
  ctx = (EVP_PKEY_CTX *)(ulong)programObject;
  bVar1 = checkLinkStatus(this,programObject);
  if (bVar1) {
    SimpleProgramCase::cleanup(&this->super_SimpleProgramCase,ctx);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Fail, expected LINK_STATUS to be TRUE.","checkLinkStatus(m_program)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
             ,0x209);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void test (void)
	{
		compileShaders();
		linkProgram();

		GLU_CHECK_MSG("Linking failed.");
		TCU_CHECK_MSG(checkLinkStatus(m_program), "Fail, expected LINK_STATUS to be TRUE.");

		cleanup();
	}